

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void exprCodeBetween(Parse *pParse,Expr *pExpr,int dest,_func_void_Parse_ptr_Expr_ptr_int_int *xJump
                    ,int jumpIfNull)

{
  code *in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  Parse *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  sqlite3 *db;
  Expr *pDel;
  int regFree1;
  Expr compRight;
  Expr compLeft;
  Expr exprAnd;
  Expr *in_stack_fffffffffffffed8;
  sqlite3 *db_00;
  Expr *pEVar1;
  Expr *pEVar2;
  undefined4 in_stack_fffffffffffffef0;
  undefined1 local_e0 [16];
  Expr *local_d0;
  undefined8 local_c8;
  undefined1 local_98 [16];
  Expr *local_88;
  undefined8 local_80;
  undefined1 local_50 [16];
  undefined1 *local_40;
  undefined1 *local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_50,0xaa,0x48);
  memset(local_98,0xaa,0x48);
  memset(local_e0,0xaa,0x48);
  pEVar1 = (Expr *)0x0;
  db_00 = in_RDI->db;
  memset(local_98,0,0x48);
  memset(local_e0,0,0x48);
  memset(local_50,0,0x48);
  pEVar1 = sqlite3ExprDup((sqlite3 *)CONCAT44(in_R8D,in_stack_fffffffffffffef0),pEVar1,
                          (int)((ulong)db_00 >> 0x20));
  if (db_00->mallocFailed == '\0') {
    local_50[0] = 0x2c;
    local_40 = local_98;
    local_38 = local_e0;
    local_98[0] = 0x3a;
    local_80 = *(undefined8 *)(*(long *)(in_RSI + 0x20) + 8);
    local_e0[0] = 0x38;
    local_c8 = *(undefined8 *)(*(long *)(in_RSI + 0x20) + 0x20);
    pEVar2 = pEVar1;
    local_d0 = pEVar1;
    local_88 = pEVar1;
    exprCodeVector((Parse *)CONCAT44(in_R8D,in_stack_fffffffffffffef0),pEVar1,(int *)db_00);
    sqlite3ExprToRegister((Expr *)db_00,(int)((ulong)pEVar1 >> 0x20));
    if (in_RCX == (code *)0x0) {
      pEVar2->flags = pEVar2->flags | 1;
      sqlite3ExprCodeTarget((Parse *)compLeft._40_8_,(Expr *)compLeft.x.pList,compLeft.pRight._4_4_)
      ;
      in_stack_fffffffffffffed8 = pEVar1;
    }
    else {
      (*in_RCX)(in_RDI,local_50,in_EDX,in_R8D);
      in_stack_fffffffffffffed8 = pEVar1;
    }
    sqlite3ReleaseTempReg(in_RDI,0);
  }
  sqlite3ExprDelete(db_00,in_stack_fffffffffffffed8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void exprCodeBetween(
  Parse *pParse,    /* Parsing and code generating context */
  Expr *pExpr,      /* The BETWEEN expression */
  int dest,         /* Jump destination or storage location */
  void (*xJump)(Parse*,Expr*,int,int), /* Action to take */
  int jumpIfNull    /* Take the jump if the BETWEEN is NULL */
){
  Expr exprAnd;     /* The AND operator in  x>=y AND x<=z  */
  Expr compLeft;    /* The  x>=y  term */
  Expr compRight;   /* The  x<=z  term */
  int regFree1 = 0; /* Temporary use register */
  Expr *pDel = 0;
  sqlite3 *db = pParse->db;

  memset(&compLeft, 0, sizeof(Expr));
  memset(&compRight, 0, sizeof(Expr));
  memset(&exprAnd, 0, sizeof(Expr));

  assert( ExprUseXList(pExpr) );
  pDel = sqlite3ExprDup(db, pExpr->pLeft, 0);
  if( db->mallocFailed==0 ){
    exprAnd.op = TK_AND;
    exprAnd.pLeft = &compLeft;
    exprAnd.pRight = &compRight;
    compLeft.op = TK_GE;
    compLeft.pLeft = pDel;
    compLeft.pRight = pExpr->x.pList->a[0].pExpr;
    compRight.op = TK_LE;
    compRight.pLeft = pDel;
    compRight.pRight = pExpr->x.pList->a[1].pExpr;
    sqlite3ExprToRegister(pDel, exprCodeVector(pParse, pDel, &regFree1));
    if( xJump ){
      xJump(pParse, &exprAnd, dest, jumpIfNull);
    }else{
      /* Mark the expression is being from the ON or USING clause of a join
      ** so that the sqlite3ExprCodeTarget() routine will not attempt to move
      ** it into the Parse.pConstExpr list.  We should use a new bit for this,
      ** for clarity, but we are out of bits in the Expr.flags field so we
      ** have to reuse the EP_OuterON bit.  Bummer. */
      pDel->flags |= EP_OuterON;
      sqlite3ExprCodeTarget(pParse, &exprAnd, dest);
    }
    sqlite3ReleaseTempReg(pParse, regFree1);
  }
  sqlite3ExprDelete(db, pDel);

  /* Ensure adequate test coverage */
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull==0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull==0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull!=0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull!=0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull==0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull==0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull!=0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull!=0 && regFree1!=0 );
  testcase( xJump==0 );
}